

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

ssize_t Curl_conn_send(Curl_easy *data,int num,void *mem,size_t len,CURLcode *code)

{
  bool bVar1;
  Curl_cfilter *local_40;
  Curl_cfilter *cf;
  CURLcode *code_local;
  size_t len_local;
  void *mem_local;
  int num_local;
  Curl_easy *data_local;
  
  local_40 = data->conn->cfilter[num];
  while( true ) {
    bVar1 = false;
    if (local_40 != (Curl_cfilter *)0x0) {
      bVar1 = (local_40->field_0x24 & 1) == 0;
    }
    if (!bVar1) break;
    local_40 = local_40->next;
  }
  if (local_40 == (Curl_cfilter *)0x0) {
    Curl_failf(data,"send: no filter connected");
    *code = CURLE_FAILED_INIT;
    data_local = (Curl_easy *)0xffffffffffffffff;
  }
  else {
    data_local = (Curl_easy *)(*local_40->cft->do_send)(local_40,data,mem,len,code);
  }
  return (ssize_t)data_local;
}

Assistant:

ssize_t Curl_conn_send(struct Curl_easy *data, int num,
                       const void *mem, size_t len, CURLcode *code)
{
  struct Curl_cfilter *cf;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  cf = data->conn->cfilter[num];
  while(cf && !cf->connected) {
    cf = cf->next;
  }
  if(cf) {
    return cf->cft->do_send(cf, data, mem, len, code);
  }
  failf(data, "send: no filter connected");
  DEBUGASSERT(0);
  *code = CURLE_FAILED_INIT;
  return -1;
}